

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O1

void __thiscall helics::zeromq::ZmqComms::closeReceiver(ZmqComms *this)

{
  string *this_00;
  int iVar1;
  error_t *this_01;
  socklen_t __len;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int __fd;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  ulong uVar4;
  undefined8 uVar5;
  void *in_R8;
  socklen_t in_R9D;
  socket_t pushSocket;
  shared_ptr<ZmqContextManager> ctx;
  ActionMessage cmd;
  string local_110;
  socket_t local_f0;
  undefined1 local_e0 [20];
  undefined4 uStack_cc;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [10];
  
  if ((uint)((this->super_NetworkCommsInterface).super_CommsInterface.txStatus._M_i + RECONNECTING)
      < 2) {
    ActionMessage::ActionMessage((ActionMessage *)(local_e0 + 0x10),cmd_protocol);
    uStack_cc = 0x16570bf;
    CommsInterface::transmit
              ((CommsInterface *)this,(route_id)0xffffffff,(ActionMessage *)(local_e0 + 0x10));
    ActionMessage::~ActionMessage((ActionMessage *)(local_e0 + 0x10));
    return;
  }
  if (((this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i & 1U) !=
      0) {
    return;
  }
  local_c8 = 0;
  local_c0[0]._M_local_buf[0] = '\0';
  unique0x100004ec = local_c0;
  ZmqContextManager::getContextPointer((ZmqContextManager *)local_e0,(string *)(local_e0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)stack0xffffffffffffff30 != local_c0) {
    operator_delete((void *)stack0xffffffffffffff30,
                    CONCAT71(local_c0[0]._M_allocated_capacity._1_7_,local_c0[0]._M_local_buf[0]) +
                    1);
  }
  zmq::socket_t::socket_t(&local_f0,*(context_t **)(local_e0._0_8_ + 0x20),8);
  local_e0._16_4_ = 200;
  __len = 4;
  zmq::detail::socket_base::setsockopt
            (&local_f0.super_socket_base,0x11,(int)local_e0 + 0x10,4,in_R8,in_R9D);
  this_00 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_00,"tcp://*");
  if (iVar1 == 0) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"tcp://127.0.0.1","");
    gmlc::networking::makePortAddress
              ((string *)(local_e0 + 0x10),&local_110,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    zmq::detail::socket_base::connect
              (&local_f0.super_socket_base,(int)stack0xffffffffffffff30,__addr_00,__len);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)stack0xffffffffffffff30 != local_c0) {
      operator_delete((void *)stack0xffffffffffffff30,
                      CONCAT71(local_c0[0]._M_allocated_capacity._1_7_,local_c0[0]._M_local_buf[0])
                      + 1);
    }
    uVar2 = local_110.field_2._M_allocated_capacity;
    uVar5 = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_002dfb9f;
  }
  else {
    gmlc::networking::makePortAddress
              ((string *)(local_e0 + 0x10),this_00,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    zmq::detail::socket_base::connect
              (&local_f0.super_socket_base,(int)stack0xffffffffffffff30,__addr,__len);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)stack0xffffffffffffff30 == local_c0) goto LAB_002dfb9f;
    uVar2 = CONCAT71(local_c0[0]._M_allocated_capacity._1_7_,local_c0[0]._M_local_buf[0]);
    uVar5 = stack0xffffffffffffff30;
  }
  operator_delete((void *)uVar5,uVar2 + 1);
LAB_002dfb9f:
  ActionMessage::ActionMessage((ActionMessage *)(local_e0 + 0x10),cmd_protocol);
  uStack_cc = 0x16570bf;
  ActionMessage::to_string_abi_cxx11_(&local_110,(ActionMessage *)(local_e0 + 0x10));
  _Var3._M_p = local_110._M_dataplus._M_p;
  iVar1 = zmq_send(local_f0.super_socket_base._handle,local_110._M_dataplus._M_p,
                   local_110._M_string_length,0);
  __fd = (int)_Var3._M_p;
  if ((iVar1 < 0) && (iVar1 = zmq_errno(), iVar1 != 0xb)) {
    this_01 = (error_t *)__cxa_allocate_exception(0x10);
    zmq::error_t::error_t(this_01);
    __cxa_throw(this_01,&zmq::error_t::typeinfo,std::exception::~exception);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    uVar4 = local_110.field_2._M_allocated_capacity + 1;
    operator_delete(local_110._M_dataplus._M_p,uVar4);
    __fd = (int)uVar4;
  }
  ActionMessage::~ActionMessage((ActionMessage *)(local_e0 + 0x10));
  zmq::socket_t::close(&local_f0,__fd);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
  }
  return;
}

Assistant:

void ZmqComms::closeReceiver()
{
    switch (getTxStatus()) {
        case ConnectionStatus::STARTUP:
        case ConnectionStatus::CONNECTED: {
            ActionMessage cmd(CMD_PROTOCOL);
            cmd.messageID = CLOSE_RECEIVER;
            transmit(control_route, cmd);
        }

        break;
        default:
            if (!disconnecting) {
                // try connecting with the receivers push socket
                auto ctx = ZmqContextManager::getContextPointer();
                zmq::socket_t pushSocket(ctx->getBaseContext(), ZMQ_PUSH);
                pushSocket.setsockopt(ZMQ_LINGER, 200);
                if (localTargetAddress == "tcp://*") {
                    pushSocket.connect(makePortAddress("tcp://127.0.0.1", PortNumber));
                } else {
                    pushSocket.connect(makePortAddress(localTargetAddress, PortNumber));
                }

                ActionMessage cmd(CMD_PROTOCOL);
                cmd.messageID = CLOSE_RECEIVER;
                pushSocket.send(cmd.to_string());
            }
            break;
    }
}